

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

TARGET_HANDLE target_create(void)

{
  AMQP_VALUE pAVar1;
  TARGET_HANDLE local_10;
  TARGET_INSTANCE *target_instance;
  
  local_10 = (TARGET_HANDLE)malloc(8);
  if (local_10 != (TARGET_HANDLE)0x0) {
    pAVar1 = amqpvalue_create_composite_with_ulong_descriptor(0x29);
    local_10->composite_value = pAVar1;
    if (local_10->composite_value == (AMQP_VALUE)0x0) {
      free(local_10);
      local_10 = (TARGET_HANDLE)0x0;
    }
  }
  return local_10;
}

Assistant:

TARGET_HANDLE target_create(void)
{
    TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)malloc(sizeof(TARGET_INSTANCE));
    if (target_instance != NULL)
    {
        target_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(41);
        if (target_instance->composite_value == NULL)
        {
            free(target_instance);
            target_instance = NULL;
        }
    }

    return target_instance;
}